

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

double xmlXPathStringEvalNumber(xmlChar *str)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  xmlChar *cur;
  xmlChar *pxVar12;
  byte *pbVar13;
  byte *pbVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (str == (xmlChar *)0x0) {
    return 0.0;
  }
  pxVar12 = str + 2;
  while( true ) {
    bVar2 = pxVar12[-2];
    if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
    pxVar12 = pxVar12 + 1;
  }
  uVar6 = (ulong)(bVar2 == 0x2d);
  bVar4 = pxVar12[uVar6 - 2];
  if (bVar4 != 0x2e && (byte)(bVar4 - 0x3a) < 0xf6) {
    return xmlXPathNAN;
  }
  dVar16 = 0.0;
  bVar11 = true;
  bVar3 = false;
  while ((byte)(bVar4 - 0x30) < 10) {
    dVar16 = dVar16 * 10.0 + (double)(bVar4 & 0xf);
    pbVar14 = pxVar12 + (uVar6 - 1);
    pxVar12 = pxVar12 + 1;
    bVar3 = true;
    bVar11 = false;
    bVar4 = *pbVar14;
  }
  if (bVar4 == 0x2e) {
    bVar4 = pxVar12[uVar6 - 1];
    if (bVar4 < 0x30) {
      if (bVar11) {
        return xmlXPathNAN;
      }
    }
    else if (!bVar3 && 0x39 < bVar4) {
      return xmlXPathNAN;
    }
    uVar10 = 0;
    while (bVar4 == 0x30) {
      lVar1 = uVar6 + uVar10;
      uVar10 = uVar10 + 1;
      bVar4 = pxVar12[lVar1];
    }
    pbVar7 = pxVar12 + uVar10 + uVar6;
    pbVar14 = pxVar12 + uVar10 + uVar6 + -2;
    pbVar13 = pxVar12 + uVar10 + uVar6 + -1;
    iVar9 = (int)uVar10;
    dVar17 = 0.0;
    while ((uVar8 = (uint)uVar10, (byte)(bVar4 - 0x30) < 10 && (uVar8 < iVar9 + 0x14U))) {
      dVar17 = dVar17 * 10.0 + (double)(int)(bVar4 - 0x30);
      pbVar13 = pbVar13 + 1;
      bVar4 = *pbVar7;
      pbVar14 = pbVar14 + 1;
      pbVar7 = pbVar7 + 1;
      uVar10 = (ulong)(uVar8 + 1);
    }
    dVar15 = pow(10.0,(double)(int)uVar8);
    do {
      bVar4 = *pbVar13;
      pbVar13 = pbVar13 + 1;
      pbVar14 = pbVar14 + 1;
    } while ((byte)(bVar4 - 0x30) < 10);
    dVar16 = dVar16 + dVar17 / dVar15;
  }
  else {
    pbVar14 = pxVar12 + (uVar6 - 2);
  }
  if ((bVar4 | 0x20) == 0x65) {
    bVar3 = true;
    if (pbVar14[1] == 0x2b) {
      pbVar14 = pbVar14 + 2;
    }
    else if (pbVar14[1] == 0x2d) {
      pbVar14 = pbVar14 + 2;
      bVar3 = false;
    }
    else {
      pbVar14 = pbVar14 + 1;
    }
    iVar9 = 0;
    for (; bVar4 = *pbVar14, (byte)(bVar4 - 0x30) < 10; pbVar14 = pbVar14 + 1) {
      if (iVar9 < 1000000) {
        iVar9 = iVar9 * 10 + -0x30 + (uint)bVar4;
      }
    }
  }
  else {
    bVar3 = true;
    iVar9 = 0;
  }
  while( true ) {
    pbVar14 = pbVar14 + 1;
    if (0x20 < bVar4) {
      return xmlXPathNAN;
    }
    if ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0) break;
    bVar4 = *pbVar14;
  }
  if ((ulong)bVar4 != 0) {
    return xmlXPathNAN;
  }
  if (bVar2 == 0x2d) {
    dVar16 = -dVar16;
  }
  iVar5 = -iVar9;
  if (bVar3) {
    iVar5 = iVar9;
  }
  dVar17 = pow(10.0,(double)iVar5);
  return dVar17 * dVar16;
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9'))) {
        return(xmlXPathNAN);
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(xmlXPathNAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(xmlXPathNAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}